

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::getFormattedDuration_abi_cxx11_(string *__return_storage_ptr__,Catch *this,double duration)

{
  int iVar1;
  allocator local_179;
  ulong local_178;
  size_t printedLength;
  char local_168 [4];
  ErrnoGuard guard;
  char buffer [314];
  size_t maxDoubleSize;
  double duration_local;
  
  ErrnoGuard::ErrnoGuard((ErrnoGuard *)((long)&printedLength + 4));
  iVar1 = snprintf(local_168,0x13a,"%.3f",duration);
  local_178 = (long)iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_168,(long)iVar1,&local_179);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  ErrnoGuard::~ErrnoGuard((ErrnoGuard *)((long)&printedLength + 4));
  return __return_storage_ptr__;
}

Assistant:

std::string getFormattedDuration( double duration ) {
        // Max exponent + 1 is required to represent the whole part
        // + 1 for decimal point
        // + 3 for the 3 decimal places
        // + 1 for null terminator
        const std::size_t maxDoubleSize = DBL_MAX_10_EXP + 1 + 1 + 3 + 1;
        char buffer[maxDoubleSize];

        // Save previous errno, to prevent sprintf from overwriting it
        ErrnoGuard guard;
#ifdef _MSC_VER
        size_t printedLength = static_cast<size_t>(
            sprintf_s( buffer, "%.3f", duration ) );
#else
        size_t printedLength = static_cast<size_t>(
            std::snprintf( buffer, maxDoubleSize, "%.3f", duration ) );
#endif
        return std::string( buffer, printedLength );
    }